

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O3

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::advance_time
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1> *this,HalfCycles duration)

{
  HalfCycles *pHVar1;
  Video *this_00;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
  *this_01;
  atomic<int> *paVar2;
  int *piVar3;
  uchar *puVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  HalfCycles HVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  HalfCycles via_cycles_outstanding;
  WrappedInt<HalfCycles> WVar13;
  long lVar14;
  
  lVar10 = (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_;
  lVar9 = (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_;
  (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ =
       lVar10 + (long)duration.super_WrappedInt<HalfCycles>.length_;
  pHVar1 = &(this->iwm_).time_since_update_;
  (pHVar1->super_WrappedInt<HalfCycles>).length_ =
       (pHVar1->super_WrappedInt<HalfCycles>).length_ +
       (long)duration.super_WrappedInt<HalfCycles>.length_;
  (this->iwm_).is_flushed_ = false;
  this->ram_subcycle_ =
       this->ram_subcycle_ + (int)duration.super_WrappedInt<HalfCycles>.length_ & 0xf;
  WVar13 = duration.super_WrappedInt<HalfCycles>.length_;
  if (lVar9 < lVar10 + (long)duration.super_WrappedInt<HalfCycles>.length_) {
    this_00 = &this->video_;
    do {
      WVar13.length_ = WVar13.length_ - (lVar9 - lVar10);
      lVar10 = (lVar9 - lVar10) + (this->via_clock_).super_WrappedInt<HalfCycles>.length_;
      (this->via_clock_).super_WrappedInt<HalfCycles>.length_ = lVar10 % 10;
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::run_for(&this->via_,(HalfCycles)(lVar10 / 10));
      Macintosh::Video::run_for
                (this_00,(HalfCycles)
                         (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_);
      (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ =
           (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ -
           (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_;
      HVar8 = Macintosh::Video::next_sequence_point(this_00);
      (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_ =
           (IntType)HVar8.super_WrappedInt<HalfCycles>.length_;
      bVar6 = Macintosh::Video::vsync(this_00);
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::set_control_line_input(&this->via_,A,One,!bVar6);
      lVar9 = (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_;
      lVar10 = 0;
    } while (lVar9 < (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_);
  }
  lVar10 = WVar13.length_ + (this->via_clock_).super_WrappedInt<HalfCycles>.length_;
  this_01 = &this->via_;
  (this->via_clock_).super_WrappedInt<HalfCycles>.length_ = lVar10 % 10;
  MOS::MOS6522::
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
  ::run_for(this_01,(HalfCycles)(lVar10 / 10));
  uVar11 = (this->keyboard_clock_).super_WrappedInt<HalfCycles>.length_ +
           (long)duration.super_WrappedInt<HalfCycles>.length_;
  (this->keyboard_clock_).super_WrappedInt<HalfCycles>.length_ = uVar11;
  if (0x4d < (long)uVar11) {
    (this->keyboard_clock_).super_WrappedInt<HalfCycles>.length_ = uVar11 % 0x4e;
    Macintosh::Keyboard::run_for(&this->keyboard_,(HalfCycles)(uVar11 / 0x4e));
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(this_01,B,Two,(bool)((byte)(this->keyboard_).response_ >> 7));
    MOS::MOS6522::
    MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
    ::set_control_line_input(this_01,B,One,(this->keyboard_).clock_output_);
  }
  if (((this->mouse_).axes_[0].super___atomic_base<int>._M_i != 0) ||
     ((this->mouse_).axes_[1].super___atomic_base<int>._M_i != 0)) {
    lVar10 = (this->time_since_mouse_update_).super_WrappedInt<HalfCycles>.length_ +
             (long)duration.super_WrappedInt<HalfCycles>.length_;
    (this->time_since_mouse_update_).super_WrappedInt<HalfCycles>.length_ = lVar10 % 0x9c4;
    if (0x9c3 < lVar10) {
      lVar10 = 0;
      bVar6 = true;
      do {
        bVar7 = bVar6;
        iVar5 = (this->mouse_).axes_[lVar10].super___atomic_base<int>._M_i;
        if (iVar5 != 0) {
          uVar12 = (this->mouse_).primaries_[lVar10] ^ 1;
          (this->mouse_).primaries_[lVar10] = uVar12;
          (this->mouse_).secondaries_[lVar10] = (uint)lVar10 ^ uVar12;
          if (iVar5 < 1) {
            LOCK();
            paVar2 = (this->mouse_).axes_ + lVar10;
            (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
            UNLOCK();
          }
          else {
            LOCK();
            paVar2 = (this->mouse_).axes_ + lVar10;
            (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
            UNLOCK();
            piVar3 = (this->mouse_).secondaries_ + lVar10;
            *(byte *)piVar3 = (byte)*piVar3 ^ 1;
          }
        }
        lVar10 = 1;
        bVar6 = false;
      } while (bVar7);
      Zilog::SCC::z8530::set_dcd(&this->scc_,0,(bool)((byte)(this->mouse_).primaries_[1] & 1));
      Zilog::SCC::z8530::set_dcd(&this->scc_,1,(bool)((byte)(this->mouse_).primaries_[0] & 1));
    }
  }
  lVar9 = (this->real_time_clock_).super_WrappedInt<HalfCycles>.length_;
  lVar10 = lVar9 + (long)duration.super_WrappedInt<HalfCycles>.length_;
  lVar14 = lVar10 / 0xef1000;
  (this->real_time_clock_).super_WrappedInt<HalfCycles>.length_ = lVar10 % 0xef1000;
  if (0x1de1ffe < lVar9 + (long)duration.super_WrappedInt<HalfCycles>.length_ + 0xef0fffU) {
    do {
      lVar10 = 0;
      do {
        puVar4 = (this->clock_).super_ClockStorage.seconds_._M_elems + lVar10;
        *puVar4 = *puVar4 + '\x01';
        if (*puVar4 != '\0') break;
        bVar6 = lVar10 != 3;
        lVar10 = lVar10 + 1;
      } while (bVar6);
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::set_control_line_input(this_01,A,Two,true);
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::VIAPortHandler>
      ::set_control_line_input(this_01,A,Two,false);
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return;
}

Assistant:

forceinline void advance_time(HalfCycles duration) {
			time_since_video_update_ += duration;
			iwm_ += duration;
			ram_subcycle_ = (ram_subcycle_ + duration.as_integral()) & 15;

			// The VIA runs at one-tenth of the 68000's clock speed, in sync with the E clock.
			// See: Guide to the Macintosh Hardware Family p149 (PDF p188). Some extra division
			// may occur here in order to provide VSYNC at a proper moment.

			// Possibly route vsync.
			if(time_since_video_update_ < time_until_video_event_) {
				via_clock_ += duration;
				via_.run_for(via_clock_.divide(HalfCycles(10)));
			} else {
				auto via_time_base = time_since_video_update_ - duration;
				auto via_cycles_outstanding = duration;
				while(time_until_video_event_ < time_since_video_update_) {
					const auto via_cycles = time_until_video_event_ - via_time_base;
					via_time_base = HalfCycles(0);
					via_cycles_outstanding -= via_cycles;

					via_clock_ += via_cycles;
					via_.run_for(via_clock_.divide(HalfCycles(10)));

					video_.run_for(time_until_video_event_);
					time_since_video_update_ -= time_until_video_event_;
					time_until_video_event_ = video_.next_sequence_point();

					via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::One, !video_.vsync());
				}

				via_clock_ += via_cycles_outstanding;
				via_.run_for(via_clock_.divide(HalfCycles(10)));
			}

			// The keyboard also has a clock, albeit a very slow one — 100,000 cycles/second.
			// Its clock and data lines are connected to the VIA.
			keyboard_clock_ += duration;
			if(keyboard_clock_ >= KEYBOARD_CLOCK_RATE) {
				const auto keyboard_ticks = keyboard_clock_.divide(KEYBOARD_CLOCK_RATE);
				keyboard_.run_for(keyboard_ticks);
				via_.set_control_line_input(MOS::MOS6522::Port::B, MOS::MOS6522::Line::Two, keyboard_.get_data());
				via_.set_control_line_input(MOS::MOS6522::Port::B, MOS::MOS6522::Line::One, keyboard_.get_clock());
			}

			// Feed mouse inputs within at most 1250 cycles of each other.
			if(mouse_.has_steps()) {
				time_since_mouse_update_ += duration;
				const auto mouse_ticks = time_since_mouse_update_.divide(HalfCycles(2500));
				if(mouse_ticks > HalfCycles(0)) {
					mouse_.prepare_step();
					scc_.set_dcd(0, mouse_.get_channel(1) & 1);
					scc_.set_dcd(1, mouse_.get_channel(0) & 1);
				}
			}

			// TODO: SCC should be clocked at a divide-by-two, if and when it actually has
			// anything connected.

			// Consider updating the real-time clock.
			real_time_clock_ += duration;
			auto ticks = real_time_clock_.divide_cycles(Cycles(CLOCK_RATE)).as_integral();
			while(ticks--) {
				clock_.update();
				// TODO: leave a delay between toggling the input rather than using this coupled hack.
				via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::Two, true);
				via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::Two, false);
			}

			// Update the SCSI if currently active.
			if constexpr (model == Analyser::Static::Macintosh::Target::Model::MacPlus) {
				if(scsi_bus_is_clocked_) scsi_bus_.run_for(duration);
			}
		}